

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConsequenceFinder.cpp
# Opt level: O2

bool __thiscall Saturation::ConsequenceFinder::isRedundant(ConsequenceFinder *this,Clause *cl)

{
  bool *pbVar1;
  uint uVar2;
  ulong n;
  uint uVar3;
  Literal **ppLVar4;
  
  uVar2 = *(uint *)&cl->field_0x38 & 0xfffff;
  uVar3 = (uint)(uVar2 != 0);
  ppLVar4 = (Literal **)0x0;
  if (uVar2 != 0) {
    ppLVar4 = cl->_literals;
  }
  while ((ppLVar4 != (Literal **)0x0 &&
         ((n = (ulong)((*ppLVar4)->super_Term)._functor,
          (*(byte *)(*(long *)(*(long *)(DAT_00a14190 + 0x80) + n * 8) + 0x40) & 0x20) == 0 ||
          (pbVar1 = Lib::Array<bool>::operator[](&(this->_redundant).super_Array<bool>,n),
          *pbVar1 == false))))) {
    ppLVar4 = cl->_literals + (int)uVar3;
    if (uVar2 <= uVar3) {
      ppLVar4 = (Literal **)0x0;
    }
    uVar3 = uVar3 + (uVar3 < uVar2);
  }
  return ppLVar4 != (Literal **)0x0;
}

Assistant:

bool ConsequenceFinder::isRedundant(Clause* cl)
{
  for (auto l : cl->iterLits()) {
    unsigned fn = l->functor();
    if(!env.signature->getPredicate(fn)->label()) {
      continue;
    }
    if(_redundant[fn]) {
      return true;
    }
  }
  return false;
}